

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

PixelBufferAccess *
tcu::getSubregion(PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *access,int x,int y,
                 int width,int height)

{
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  PixelBufferAccess *access_local;
  
  getSubregion(__return_storage_ptr__,access,x,y,0,width,height,1);
  return __return_storage_ptr__;
}

Assistant:

PixelBufferAccess getSubregion (const PixelBufferAccess& access, int x, int y, int width, int height)
{
	return getSubregion(access, x, y, 0, width, height, 1);
}